

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I444Copy(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
            int src_stride_v,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,
            uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  long in_R8;
  undefined4 unaff_retaddr;
  int in_stack_00000038;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((((in_RDX == 0) || (in_R8 == 0)) || (src_u == (uint8_t *)0x0)) ||
     (((src_y == (uint8_t *)0x0 || (in_stack_00000038 < 1)) || ((int)dst_y == 0)))) {
    iVar1 = -1;
  }
  else {
    if ((int)dst_y < 0) {
      in_RDI = in_RDI + (-(int)dst_y + -1) * in_ESI;
      in_RDX = in_RDX + (-(int)dst_y + -1) * in_ECX;
      in_ESI = -in_ESI;
    }
    iVar1 = (int)((ulong)in_RDX >> 0x20);
    if (src_v != (uint8_t *)0x0) {
      CopyPlane((uint8_t *)CONCAT44(src_stride_v,unaff_retaddr),in_stack_fffffffffffffffc,in_RDI,
                in_ESI,in_stack_ffffffffffffffe8,iVar1);
    }
    CopyPlane((uint8_t *)CONCAT44(src_stride_v,unaff_retaddr),in_stack_fffffffffffffffc,in_RDI,
              in_ESI,in_stack_ffffffffffffffe8,iVar1);
    CopyPlane((uint8_t *)CONCAT44(src_stride_v,unaff_retaddr),in_stack_fffffffffffffffc,in_RDI,
              in_ESI,in_stack_ffffffffffffffe8,iVar1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I444Copy(const uint8_t* src_y,
             int src_stride_y,
             const uint8_t* src_u,
             int src_stride_u,
             const uint8_t* src_v,
             int src_stride_v,
             uint8_t* dst_y,
             int dst_stride_y,
             uint8_t* dst_u,
             int dst_stride_u,
             uint8_t* dst_v,
             int dst_stride_v,
             int width,
             int height) {
  if (!src_u || !src_v || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_u = src_u + (height - 1) * src_stride_u;
    src_v = src_v + (height - 1) * src_stride_v;
    src_stride_y = -src_stride_y;
    src_stride_u = -src_stride_u;
    src_stride_v = -src_stride_v;
  }

  if (dst_y) {
    CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  }
  CopyPlane(src_u, src_stride_u, dst_u, dst_stride_u, width, height);
  CopyPlane(src_v, src_stride_v, dst_v, dst_stride_v, width, height);
  return 0;
}